

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

bool __thiscall
MT32Emu::MidiEventQueue::pushShortMessage
          (MidiEventQueue *this,Bit32u shortMessageData,Bit32u timestamp)

{
  Bit32u BVar1;
  uint uVar2;
  MidiEvent *pMVar3;
  uint uVar4;
  
  uVar4 = this->endPosition + 1 & this->ringBufferMask;
  BVar1 = this->startPosition;
  if (BVar1 != uVar4) {
    pMVar3 = this->ringBuffer;
    uVar2 = this->endPosition;
    (*this->sysexDataStorage->_vptr_SysexDataStorage[4])
              (this->sysexDataStorage,pMVar3[uVar2].sysexData,
               (ulong)pMVar3[uVar2].field_1.sysexLength);
    pMVar3[uVar2].sysexData = (Bit8u *)0x0;
    pMVar3[uVar2].field_1.sysexLength = shortMessageData;
    pMVar3[uVar2].timestamp = timestamp;
    this->endPosition = uVar4;
  }
  return BVar1 != uVar4;
}

Assistant:

bool MidiEventQueue::pushShortMessage(Bit32u shortMessageData, Bit32u timestamp) {
	Bit32u newEndPosition = (endPosition + 1) & ringBufferMask;
	// If ring buffer is full, bail out.
	if (startPosition == newEndPosition) return false;
	volatile MidiEvent &newEvent = ringBuffer[endPosition];
	sysexDataStorage.dispose(newEvent.sysexData, newEvent.sysexLength);
	newEvent.sysexData = NULL;
	newEvent.shortMessageData = shortMessageData;
	newEvent.timestamp = timestamp;
	endPosition = newEndPosition;
	return true;
}